

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O0

ssize_t sftp_bin2attr(LIBSSH2_SFTP_ATTRIBUTES *attrs,uchar *p,size_t data_len)

{
  int iVar1;
  uchar *local_80;
  uchar *edata;
  size_t edata_len;
  uchar *etype;
  size_t etype_len;
  uint32_t i;
  uint32_t extended_count;
  uint32_t mtime;
  uint32_t atime;
  uint32_t permissions;
  uint32_t gid;
  uint32_t uid;
  uint32_t flags;
  string_buf buf;
  size_t data_len_local;
  uchar *p_local;
  LIBSSH2_SFTP_ATTRIBUTES *attrs_local;
  
  gid = 0;
  _uid = p;
  buf.data = p;
  buf.dataptr = (uchar *)data_len;
  buf.len = data_len;
  iVar1 = _libssh2_get_u32((string_buf *)&uid,&gid);
  if (iVar1 == 0) {
    attrs->flags = (ulong)gid;
    if (((attrs->flags & 1) == 0) ||
       (iVar1 = _libssh2_get_u64((string_buf *)&uid,&attrs->filesize), iVar1 == 0)) {
      if ((attrs->flags & 2) != 0) {
        permissions = 0;
        atime = 0;
        iVar1 = _libssh2_get_u32((string_buf *)&uid,&permissions);
        if ((iVar1 != 0) || (iVar1 = _libssh2_get_u32((string_buf *)&uid,&atime), iVar1 != 0)) {
          return -0x26;
        }
        attrs->uid = (ulong)permissions;
        attrs->gid = (ulong)atime;
      }
      if ((attrs->flags & 4) != 0) {
        iVar1 = _libssh2_get_u32((string_buf *)&uid,&mtime);
        if (iVar1 != 0) {
          return -0x26;
        }
        attrs->permissions = (ulong)mtime;
      }
      if ((attrs->flags & 8) != 0) {
        iVar1 = _libssh2_get_u32((string_buf *)&uid,&extended_count);
        if ((iVar1 != 0) || (iVar1 = _libssh2_get_u32((string_buf *)&uid,&i), iVar1 != 0)) {
          return -0x26;
        }
        attrs->atime = (ulong)extended_count;
        attrs->mtime = (ulong)i;
      }
      if ((attrs->flags & 0x80000000) != 0) {
        iVar1 = _libssh2_get_u32((string_buf *)&uid,(uint32_t *)((long)&etype_len + 4));
        if (iVar1 != 0) {
          return -0x26;
        }
        for (etype_len._0_4_ = 0; (uint)etype_len < etype_len._4_4_;
            etype_len._0_4_ = (uint)etype_len + 1) {
          iVar1 = _libssh2_get_string((string_buf *)&uid,(uchar **)&edata_len,(size_t *)&etype);
          if ((iVar1 != 0) ||
             (iVar1 = _libssh2_get_string((string_buf *)&uid,&local_80,(size_t *)&edata), iVar1 != 0
             )) {
            return -0x26;
          }
        }
      }
      attrs_local = (LIBSSH2_SFTP_ATTRIBUTES *)(buf.data + -(long)_uid);
    }
    else {
      attrs_local = (LIBSSH2_SFTP_ATTRIBUTES *)0xffffffffffffffda;
    }
  }
  else {
    attrs_local = (LIBSSH2_SFTP_ATTRIBUTES *)0xffffffffffffffda;
  }
  return (ssize_t)attrs_local;
}

Assistant:

static ssize_t
sftp_bin2attr(LIBSSH2_SFTP_ATTRIBUTES *attrs, const unsigned char *p,
              size_t data_len)
{
    struct string_buf buf;
    uint32_t flags = 0;
    buf.data = (unsigned char *)p;
    buf.dataptr = buf.data;
    buf.len = data_len;

    if(_libssh2_get_u32(&buf, &flags)) {
        return LIBSSH2_ERROR_BUFFER_TOO_SMALL;
    }
    attrs->flags = flags;

    if(attrs->flags & LIBSSH2_SFTP_ATTR_SIZE) {
        if(_libssh2_get_u64(&buf, &(attrs->filesize))) {
            return LIBSSH2_ERROR_BUFFER_TOO_SMALL;
        }
    }

    if(attrs->flags & LIBSSH2_SFTP_ATTR_UIDGID) {
        uint32_t uid = 0;
        uint32_t gid = 0;
        if(_libssh2_get_u32(&buf, &uid) ||
           _libssh2_get_u32(&buf, &gid)) {
            return LIBSSH2_ERROR_BUFFER_TOO_SMALL;
        }
        attrs->uid = uid;
        attrs->gid = gid;
    }

    if(attrs->flags & LIBSSH2_SFTP_ATTR_PERMISSIONS) {
        uint32_t permissions;
        if(_libssh2_get_u32(&buf, &permissions)) {
            return LIBSSH2_ERROR_BUFFER_TOO_SMALL;
        }
        attrs->permissions = permissions;
    }

    if(attrs->flags & LIBSSH2_SFTP_ATTR_ACMODTIME) {
        uint32_t atime;
        uint32_t mtime;
        if(_libssh2_get_u32(&buf, &atime) ||
           _libssh2_get_u32(&buf, &mtime)) {
            return LIBSSH2_ERROR_BUFFER_TOO_SMALL;
        }
        attrs->atime = atime;
        attrs->mtime = mtime;
    }

    /* Parse extended data, if present, to avoid stream parsing errors */
    if(attrs->flags & LIBSSH2_SFTP_ATTR_EXTENDED) {
        uint32_t extended_count;
        uint32_t i;
        size_t etype_len;
        unsigned char *etype;
        size_t edata_len;
        unsigned char *edata;

        if(_libssh2_get_u32(&buf, &extended_count)) {
            return LIBSSH2_ERROR_BUFFER_TOO_SMALL;
        }

        for(i = 0; i < extended_count; ++i) {
            if(_libssh2_get_string(&buf, &etype, &etype_len) ||
               _libssh2_get_string(&buf, &edata, &edata_len)) {
                return LIBSSH2_ERROR_BUFFER_TOO_SMALL;
            }
        }
    }

    return buf.dataptr - buf.data;
}